

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O2

bool glcts::verifyImage<unsigned_int,4u>
               (GLuint image_width,GLuint image_height,uint *components,uint *image)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  GLuint x;
  ulong uVar6;
  long lVar7;
  
  uVar3 = 0;
  for (uVar4 = 0; uVar4 != image_height; uVar4 = uVar4 + 1) {
    uVar5 = uVar3;
    for (uVar6 = 0; uVar6 != image_width; uVar6 = uVar6 + 1) {
      lVar7 = 0;
      while (lVar7 != 4) {
        lVar2 = (ulong)uVar5 + lVar7;
        puVar1 = components + lVar7;
        lVar7 = lVar7 + 1;
        if (image[lVar2] != *puVar1) goto LAB_00d30b7c;
      }
      uVar5 = uVar5 + 4;
    }
    uVar3 = uVar3 + image_width * 4;
  }
LAB_00d30b7c:
  return image_height <= uVar4;
}

Assistant:

bool verifyImage(glw::GLuint image_width, glw::GLuint image_height, const T* components, const T* image)
{
	const glw::GLuint line_size = image_width * N_Components;

	for (glw::GLuint y = 0; y < image_height; ++y)
	{
		const glw::GLuint line_offset = y * line_size;

		for (glw::GLuint x = 0; x < image_width; ++x)
		{
			const glw::GLuint pixel_offset = line_offset + x * N_Components;

			for (glw::GLuint component = 0; component < N_Components; ++component)
			{
				if (image[pixel_offset + component] != components[component])
				{
					return false;
				}
			} /* for (all components) */
		}	 /* for (all columns) */
	}		  /* for (all rows) */

	return true;
}